

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::DefineGroupFixedInst::Exec
          (DefineGroupFixedInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  int iVar1;
  uint uVar2;
  Type TVar3;
  PageAllocation *pPVar4;
  GroupInfo *pGVar5;
  code *pcVar6;
  bool bVar7;
  size_t sVar8;
  undefined4 *puVar9;
  long lVar10;
  
  if ((this->super_NoNeedToSaveMixin).noNeedToSave == false) {
    sVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.bufferSize;
    if (sVar8 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                super_ContinuousPageStack<1UL>.nextTop < 0x18) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x18);
      sVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.bufferSize;
    }
    if (sVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar7) goto LAB_00ef6fe1;
      *puVar9 = 0;
    }
    pPVar4 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar8 + 0x18;
    *(size_t *)((long)&pPVar4[1].pageCount + sVar8) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x18;
    iVar1 = (this->super_GroupMixin).groupId;
    *(undefined1 *)((long)&pPVar4[2].pageCount + sVar8) = 3;
    *(undefined ***)((long)&pPVar4[1].segment + sVar8) = &PTR_Print_01543308;
    *(int *)((long)&pPVar4[2].pageCount + sVar8 + 4) = iVar1;
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar2 = (this->super_GroupMixin).groupId;
  lVar10 = (long)(int)uVar2;
  if ((lVar10 < 0) || (((matcher->program).ptr)->numGroups <= uVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar7) goto LAB_00ef6fe1;
    *puVar9 = 0;
  }
  pGVar5 = (matcher->groupInfos).ptr;
  if (pGVar5[lVar10].length != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xb20,"(groupInfo->IsUndefined())","groupInfo->IsUndefined()");
    if (!bVar7) {
LAB_00ef6fe1:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar9 = 0;
  }
  TVar3 = (this->super_FixedLengthMixin).length;
  pGVar5[lVar10].offset = *inputOffset - TVar3;
  pGVar5[lVar10].length = TVar3;
  *instPointer = *instPointer + 10;
  return false;
}

Assistant:

inline bool DefineGroupFixedInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (!noNeedToSave)
        {
            // UNDO ACTION: Restore group on backtrack
            PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
        Assert(groupInfo->IsUndefined());
        groupInfo->offset = inputOffset - length;
        groupInfo->length = length;

        instPointer += sizeof(*this);
        return false;
    }